

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3FindDbName(sqlite3 *db,char *zName)

{
  int iVar1;
  int iVar2;
  Db *pDVar3;
  ulong uVar4;
  
  if (zName != (char *)0x0) {
    uVar4 = (long)db->nDb - 1;
    if ((long)db->nDb < 1) goto LAB_0012b18f;
    pDVar3 = db->aDb + uVar4;
    do {
      if (pDVar3->zDbSName != (char *)0x0) {
        iVar1 = sqlite3StrICmp(pDVar3->zDbSName,zName);
        if (iVar1 == 0) goto LAB_0012b18f;
      }
      iVar1 = (int)uVar4;
      if (iVar1 == 0) {
        iVar2 = sqlite3StrICmp("main",zName);
        if (iVar2 == 0) goto LAB_0012b18f;
      }
      pDVar3 = pDVar3 + -1;
      uVar4 = (ulong)(iVar1 - 1);
    } while (0 < iVar1);
  }
  uVar4 = 0xffffffff;
LAB_0012b18f:
  return (int)uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3FindDbName(sqlite3 *db, const char *zName){
  int i = -1;         /* Database number */
  if( zName ){
    Db *pDb;
    for(i=(db->nDb-1), pDb=&db->aDb[i]; i>=0; i--, pDb--){
      if( 0==sqlite3_stricmp(pDb->zDbSName, zName) ) break;
      /* "main" is always an acceptable alias for the primary database
      ** even if it has been renamed using SQLITE_DBCONFIG_MAINDBNAME. */
      if( i==0 && 0==sqlite3_stricmp("main", zName) ) break;
    }
  }
  return i;
}